

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Vector<float,_2>_>::VariableStatement
          (VariableStatement<tcu::Vector<float,_2>_> *this,
          VariableP<tcu::Vector<float,_2>_> *variable,ExprP<tcu::Vector<float,_2>_> *value,
          bool isDeclaration)

{
  bool isDeclaration_local;
  ExprP<tcu::Vector<float,_2>_> *value_local;
  VariableP<tcu::Vector<float,_2>_> *variable_local;
  VariableStatement<tcu::Vector<float,_2>_> *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_016775d8;
  VariableP<tcu::Vector<float,_2>_>::VariableP(&this->m_variable,variable);
  ExprP<tcu::Vector<float,_2>_>::ExprP(&this->m_value,value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}